

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetJoin.cpp
# Opt level: O0

void __thiscall
SetJoinIRCCommand::trigger
          (SetJoinIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Config *pCVar1;
  IRC_Bot *pIVar2;
  char *pcVar3;
  bool bVar4;
  undefined8 uVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  size_t local_d0;
  char *local_c8;
  size_t local_b0;
  char *local_a8;
  allocator<char> local_79;
  string local_78 [32];
  SetJoinIRCCommand *local_58;
  size_t sStack_50;
  undefined1 local_48 [16];
  IRC_Bot *local_38;
  IRC_Bot *source_local;
  SetJoinIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (SetJoinIRCCommand *)nick._M_len;
  nick_local._M_str = (char *)channel._M_len;
  local_38 = source;
  source_local = (IRC_Bot *)this;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  pcVar3 = nick_local._M_str;
  pIVar2 = local_38;
  pCVar1 = pluginInstance.setjoin_file;
  if (bVar4) {
    bVar6 = sv("Too few parameters! Syntax: setjoin <message>",0x2d);
    local_d0 = bVar6._M_len;
    local_c8 = bVar6._M_str;
    Jupiter::IRC::Client::sendMessage(pIVar2,pcVar3,channel._M_str,local_d0,local_c8);
  }
  else {
    local_48 = Jupiter::IRC::Client::getConfigSection();
    uVar5 = Jupiter::Config::operator[](pCVar1,local_48._0_8_,local_48._8_8_);
    local_58 = this_local;
    sStack_50 = nick_local._M_len;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_78,&parameters,&local_79);
    Jupiter::Config::set(uVar5,local_58,sStack_50,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    Jupiter::Config::write();
    pcVar3 = nick_local._M_str;
    pIVar2 = local_38;
    bVar6 = sv("Your join message has been set.",0x1f);
    local_b0 = bVar6._M_len;
    local_a8 = bVar6._M_str;
    Jupiter::IRC::Client::sendMessage(pIVar2,pcVar3,channel._M_str,local_b0,local_a8);
  }
  return;
}

Assistant:

void SetJoinIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		pluginInstance.setjoin_file[source->getConfigSection()].set(nick, static_cast<std::string>(parameters));
		pluginInstance.setjoin_file.write();
		source->sendMessage(channel, "Your join message has been set."sv);
	}
	else source->sendMessage(channel, "Too few parameters! Syntax: setjoin <message>"sv);
}